

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::check_stream
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,char *message)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (((&this->field_0x48)[*(long *)(*(long *)&this->stream_ + -0x18)] & 5) == 0) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"failed to ",&local_59);
  std::operator+(&local_58,&local_38,message);
  raise_stream_error(this,(string *)&local_58);
}

Assistant:

void check_stream(const char* message)
    {
        if (stream_.fail())
        {
            raise_stream_error(std::string("failed to ") + message);
        }
    }